

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRProgram.cc
# Opt level: O0

ConstantValue<long,_(flow::LiteralType)2> * __thiscall
flow::IRProgram::get<flow::ConstantValue<long,(flow::LiteralType)2>,long>
          (IRProgram *this,
          vector<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>_>_>
          *table,long *literal)

{
  long *this_00;
  reference pvVar1;
  pointer pCVar2;
  long lVar3;
  unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>
  local_40;
  size_type local_38;
  size_t e;
  size_t i;
  long *literal_local;
  vector<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>_>_>
  *table_local;
  IRProgram *this_local;
  
  e = 0;
  i = (size_t)literal;
  literal_local = (long *)table;
  table_local = (vector<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>_>_>
                 *)this;
  local_38 = std::
             vector<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>_>_>
             ::size(table);
  while( true ) {
    this_00 = literal_local;
    if (e == local_38) {
      std::make_unique<flow::ConstantValue<long,(flow::LiteralType)2>,long_const&>
                ((long *)&local_40);
      std::
      vector<std::unique_ptr<flow::ConstantValue<long,(flow::LiteralType)2>,std::default_delete<flow::ConstantValue<long,(flow::LiteralType)2>>>,std::allocator<std::unique_ptr<flow::ConstantValue<long,(flow::LiteralType)2>,std::default_delete<flow::ConstantValue<long,(flow::LiteralType)2>>>>>
      ::
      emplace_back<std::unique_ptr<flow::ConstantValue<long,(flow::LiteralType)2>,std::default_delete<flow::ConstantValue<long,(flow::LiteralType)2>>>>
                ((vector<std::unique_ptr<flow::ConstantValue<long,(flow::LiteralType)2>,std::default_delete<flow::ConstantValue<long,(flow::LiteralType)2>>>,std::allocator<std::unique_ptr<flow::ConstantValue<long,(flow::LiteralType)2>,std::default_delete<flow::ConstantValue<long,(flow::LiteralType)2>>>>>
                  *)this_00,&local_40);
      std::
      unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>
      ::~unique_ptr(&local_40);
      pvVar1 = std::
               vector<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>_>_>
               ::back((vector<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>_>_>
                       *)literal_local);
      pCVar2 = std::
               unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>
               ::get(pvVar1);
      return pCVar2;
    }
    pvVar1 = std::
             vector<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>_>_>
             ::operator[]((vector<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>_>_>
                           *)literal_local,e);
    pCVar2 = std::
             unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>
             ::operator->(pvVar1);
    lVar3 = ConstantValue<long,_(flow::LiteralType)2>::get(pCVar2);
    if (lVar3 == *(long *)i) break;
    e = e + 1;
  }
  pvVar1 = std::
           vector<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>_>_>
           ::operator[]((vector<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>,_std::allocator<std::unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>_>_>
                         *)literal_local,e);
  pCVar2 = std::
           unique_ptr<flow::ConstantValue<long,_(flow::LiteralType)2>,_std::default_delete<flow::ConstantValue<long,_(flow::LiteralType)2>_>_>
           ::get(pvVar1);
  return pCVar2;
}

Assistant:

T* IRProgram::get(std::vector<std::unique_ptr<T>>& table, const U& literal) {
  for (size_t i = 0, e = table.size(); i != e; ++i)
    if (table[i]->get() == literal)
      return table[i].get();

  table.emplace_back(std::make_unique<T>(literal));
  return table.back().get();
}